

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Serializers.hpp
# Opt level: O3

XMLNodeAdapter * BSDFData::operator>>(XMLNodeAdapter *node,Wavelength *wavelength)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  string local_60;
  function<BSDFData::WavelengthUnit_(std::basic_string_view<char,_std::char_traits<char>_>)>
  local_40;
  
  paVar1 = &local_60.field_2;
  local_60._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_60,"unit","");
  local_40.super__Function_base._M_functor._8_8_ = 0;
  local_40.super__Function_base._M_functor._M_unused._M_object = WavelengthUnitFromString;
  local_40._M_invoker =
       std::
       _Function_handler<BSDFData::WavelengthUnit_(std::basic_string_view<char,_std::char_traits<char>_>),_BSDFData::WavelengthUnit_(*)(std::basic_string_view<char,_std::char_traits<char>_>)>
       ::_M_invoke;
  local_40.super__Function_base._M_manager =
       std::
       _Function_handler<BSDFData::WavelengthUnit_(std::basic_string_view<char,_std::char_traits<char>_>),_BSDFData::WavelengthUnit_(*)(std::basic_string_view<char,_std::char_traits<char>_>)>
       ::_M_manager;
  FileParse::loadAttribute<XMLNodeAdapter,_BSDFData::WavelengthUnit,_0>
            (node,&local_60,&wavelength->unit,&local_40);
  if (local_40.super__Function_base._M_manager != (_Manager_type)0x0) {
    (*local_40.super__Function_base._M_manager)
              ((_Any_data *)&local_40,(_Any_data *)&local_40,__destroy_functor);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_60._M_dataplus._M_p != paVar1) {
    operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
  }
  local_60._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_60,"type","");
  FileParse::loadAttribute<XMLNodeAdapter>(node,&local_60,&wavelength->type);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_60._M_dataplus._M_p != paVar1) {
    operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
  }
  (*(node->super_INodeAdapter<XMLNodeAdapter>)._vptr_INodeAdapter[4])(&local_60,node);
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
            (&wavelength->value,&local_60);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_60._M_dataplus._M_p != paVar1) {
    operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
  }
  return node;
}

Assistant:

const NodeAdapter & operator>>(const NodeAdapter & node, BSDFData::Wavelength & wavelength)
    {
        using FileParse::operator>>;   // operators for basic C++ types are in the FileParse
                                       // namespace

        FileParse::loadAttribute<NodeAdapter, BSDFData::WavelengthUnit>(
          node, "unit", wavelength.unit, WavelengthUnitFromString);
        FileParse::loadAttribute(node, "type", wavelength.type);
        node >> wavelength.value;

        return node;
    }